

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadNode.h
# Opt level: O1

int __thiscall
duckdb_skiplistlib::skip_list::
HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
::remove(HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
         *this,char *__filename)

{
  int iVar1;
  undefined4 extraout_var;
  char *__filename_00;
  long lVar2;
  pair<unsigned_long,_signed_char> pVar3;
  Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
  *pNode;
  
  lVar2 = (long)(this->_nodeRefs)._nodes.
                super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->_nodeRefs)._nodes.
                super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  __filename_00 = (char *)(lVar2 >> 4);
  do {
    __filename_00 = __filename_00 + -1;
    pNode = (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
             *)0x0;
    if (__filename_00 == (char *)0xffffffffffffffff) break;
    iVar1 = Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
            ::remove(*(Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                       **)((long)&(this->_nodeRefs)._nodes.
                                  super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].pNode + lVar2),
                     __filename_00);
    pNode = (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
             *)CONCAT44(extraout_var,iVar1);
    lVar2 = lVar2 + -0x10;
  } while (pNode == (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                     *)0x0);
  if (pNode == (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                *)0x0) {
    _throwValueErrorNotFound(this,(pair<unsigned_long,_signed_char> *)__filename);
  }
  _adjRemoveRefs(this,(pNode->_nodeRefs)._swapLevel,pNode);
  this->_count = this->_count - 1;
  pVar3 = Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
          ::_Pool::Release(&this->_pool,pNode);
  return (int)pVar3.first;
}

Assistant:

T HeadNode<T, _Compare>::remove(const T &value) {
#ifdef SKIPLIST_THREAD_SUPPORT
    std::lock_guard<std::mutex> lock(gSkipListMutex);
#ifdef SKIPLIST_THREAD_SUPPORT_TRACE
    std::cout << "HeadNode remove() thread: " << std::this_thread::get_id() << std::endl;
#endif
#endif
    Node<T, _Compare> *pNode = nullptr;
    size_t level;

    _throwIfValueDoesNotCompare(value);
    for (level = _nodeRefs.height(); level-- > 0;) {
        assert(_nodeRefs[level].pNode);
        pNode = _nodeRefs[level].pNode->remove(level, value);
        if (pNode) {
            break;
        }
    }
    if (! pNode) {
        _throwValueErrorNotFound(value);
    }
    // Take swap level as some swaps will have been dealt with by the remove() above.
    _adjRemoveRefs(pNode->nodeRefs().swapLevel(), pNode);
    --_count;
    T ret_val = _pool.Release(pNode);
#ifdef SKIPLIST_THREAD_SUPPORT_TRACE
    std::cout << "HeadNode remove() thread: " << std::this_thread::get_id() << " DONE" << std::endl;
#endif
    return ret_val;
}